

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leg_track.cpp
# Opt level: O2

void __thiscall
cp::LegTrack::setStepVar
          (LegTrack *this,Pose *ref_landpose_leg_w,Quat *ref_waist,rl swingleg,walking_state wstate)

{
  Pose *pose;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_48;
  
  *(double *)(this + 0x1e0) = *(double *)(this + 0x1b8);
  *(double *)(this + 0x1e8) = *(double *)(this + 0x1c0);
  *(undefined8 *)(this + 0x1f0) = *(undefined8 *)(this + 0x1b0);
  *(double *)(this + 0x1f8) = *(double *)(this + 0x1c0) + *(double *)(this + 0x1b8);
  *(rl *)(this + 0x440) = swingleg;
  *(walking_state *)(this + 0x444) = wstate;
  pose = (Pose *)(this + 0x260);
  Pose::set((Pose *)(this + 0x610),pose);
  Pose::set((Pose *)(this + 0x6f0),(Pose *)(this + 0x340));
  Pose::set(pose,ref_landpose_leg_w);
  Pose::set((Pose *)(this + 0x340),ref_landpose_leg_w + 1);
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
            ((Matrix<double,_4,_1,_0,_4,_1> *)(this + 0x240),
             (Matrix<double,_4,_1,_0,_4,_1> *)(this + 0x220));
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
            ((Matrix<double,_4,_1,_0,_4,_1> *)(this + 0x220),&ref_waist->m_coeffs);
  local_48.m_xpr = (Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x420);
  local_48.m_row = 0;
  local_48.m_col = 1;
  local_48.m_currentBlockRows = 1;
  *(Scalar *)(this + 0x420) = *(Scalar *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x618 + -8)
  ;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            (&local_48,(Scalar *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x618));
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished(&local_48);
  local_48.m_xpr = (Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x430);
  local_48.m_row = 0;
  local_48.m_col = 1;
  local_48.m_currentBlockRows = 1;
  *(double *)(this + 0x430) =
       pose[*(uint *)(this + 0x440)].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
       .m_storage.m_data.array[0];
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            (&local_48,
             pose[*(uint *)(this + 0x440)].pp.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 1
            );
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished(&local_48);
  interpolation<double>::setInter5
            ((interpolation<double> *)this,*(double *)(this + 0x1d8),0.0,0.0,
             *(double *)(this + 0x1d0),0.0,0.0,*(double *)(this + 0x1b8) * 0.5);
  interpolation<double>::setInter5
            ((interpolation<double> *)(this + 0x30),*(double *)(this + 0x1d0),0.0,0.0,
             *(double *)(this + 0x1d8),0.0,0.0,*(double *)(this + 0x1b8) * 0.5);
  return;
}

Assistant:

void LegTrack::setStepVar(const Pose ref_landpose_leg_w[],
     const Quat &ref_waist, rl swingleg, walking_state wstate) {
  // set time var of a step
  sst_s = sst;
  dst_s = dst;
  dt_s  = dt;
  st_s = sst_s + dst_s;
  swl = swingleg;
  ws = wstate;
  // set next landing pos
  bfr_landpose[right].set(ref_landpose[right]);
  bfr_landpose[left].set(ref_landpose[left]);
  ref_landpose[right].set(ref_landpose_leg_w[right]);
  ref_landpose[left].set(ref_landpose_leg_w[left]);
  bfr_waist_r = ref_waist_r;
  ref_waist_r = ref_waist;

  // for (x, y) lerp
  bfr << bfr_landpose[swl].p().x(), bfr_landpose[swl].p().y();
  ref << ref_landpose[swl].p().x(), ref_landpose[swl].p().y();
  // for z lerp
  inter_z_1.setInter5(ground_h, 0.0, 0.0, leg_h, 0.0, 0.0, sst*0.5);
  inter_z_2.setInter5(leg_h, 0.0, 0.0, ground_h, 0.0, 0.0, sst*0.5);
}